

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall Diligent::BufferDesc::BufferDesc(BufferDesc *this)

{
  BufferDesc *this_local;
  
  DeviceObjectAttribs::DeviceObjectAttribs(&this->super_DeviceObjectAttribs);
  this->Size = 0;
  this->BindFlags = BIND_NONE;
  this->Usage = USAGE_DEFAULT;
  this->CPUAccessFlags = CPU_ACCESS_NONE;
  this->Mode = BUFFER_MODE_UNDEFINED;
  this->MiscFlags = MISC_BUFFER_FLAG_NONE;
  this->ElementByteStride = 0;
  this->ImmediateContextMask = 1;
  return;
}

Assistant:

constexpr BufferDesc() noexcept {}